

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O3

void __thiscall
duckdb::DataChunk::Append
          (DataChunk *this,DataChunk *other,bool resize,SelectionVector *sel,idx_t sel_count)

{
  uint64_t new_size;
  reference pvVar1;
  pointer pVVar2;
  const_reference source;
  InternalException *pIVar3;
  pointer pVVar4;
  idx_t iVar5;
  ulong v;
  size_type sVar6;
  string local_50;
  
  iVar5 = sel_count;
  if (sel == (SelectionVector *)0x0) {
    iVar5 = other->count;
  }
  if (other->count != 0) {
    pVVar2 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar4 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pVVar4 - (long)pVVar2 !=
        (long)(other->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(other->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start) {
      pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Column counts of appending chunk doesn\'t match!","");
      InternalException::InternalException(pIVar3,&local_50);
      __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    v = iVar5 + this->count;
    if (this->capacity < v) {
      if (!resize) {
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Can\'t append chunk to other chunk without resizing","");
        InternalException::InternalException(pIVar3,&local_50);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      new_size = NextPowerOfTwo(v);
      pVVar2 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pVVar4 = pVVar2;
      if (pVVar2 != (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        sVar6 = 0;
        do {
          pvVar1 = vector<duckdb::Vector,_true>::operator[](&this->data,sVar6);
          Vector::Resize(pvVar1,this->count,new_size);
          sVar6 = sVar6 + 1;
          pVVar2 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pVVar4 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        } while (sVar6 < (ulong)(((long)pVVar4 - (long)pVVar2 >> 3) * 0x4ec4ec4ec4ec4ec5));
      }
      this->capacity = new_size;
    }
    if (pVVar4 != pVVar2) {
      sVar6 = 0;
      do {
        source = vector<duckdb::Vector,_true>::operator[](&other->data,sVar6);
        pvVar1 = vector<duckdb::Vector,_true>::operator[](&this->data,sVar6);
        if (sel == (SelectionVector *)0x0) {
          VectorOperations::Copy(source,pvVar1,other->count,0,this->count);
        }
        else {
          VectorOperations::Copy(source,pvVar1,sel,sel_count,0,this->count);
        }
        sVar6 = sVar6 + 1;
      } while (sVar6 < (ulong)(((long)(this->data).
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->data).
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              0x4ec4ec4ec4ec4ec5));
    }
    this->count = v;
  }
  return;
}

Assistant:

void DataChunk::Append(const DataChunk &other, bool resize, SelectionVector *sel, idx_t sel_count) {
	idx_t new_size = sel ? size() + sel_count : size() + other.size();
	if (other.size() == 0) {
		return;
	}
	if (ColumnCount() != other.ColumnCount()) {
		throw InternalException("Column counts of appending chunk doesn't match!");
	}
	if (new_size > capacity) {
		if (resize) {
			auto new_capacity = NextPowerOfTwo(new_size);
			for (idx_t i = 0; i < ColumnCount(); i++) {
				data[i].Resize(size(), new_capacity);
			}
			capacity = new_capacity;
		} else {
			throw InternalException("Can't append chunk to other chunk without resizing");
		}
	}
	for (idx_t i = 0; i < ColumnCount(); i++) {
		D_ASSERT(data[i].GetVectorType() == VectorType::FLAT_VECTOR);
		if (sel) {
			VectorOperations::Copy(other.data[i], data[i], *sel, sel_count, 0, size());
		} else {
			VectorOperations::Copy(other.data[i], data[i], other.size(), 0, size());
		}
	}
	SetCardinality(new_size);
}